

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea_p.h
# Opt level: O2

void __thiscall
QAbstractScrollAreaFilter::QAbstractScrollAreaFilter
          (QAbstractScrollAreaFilter *this,QAbstractScrollAreaPrivate *p)

{
  QAnyStringView QVar1;
  
  QObject::QObject((QObject *)this,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_007c49e0;
  *(QAbstractScrollAreaPrivate **)(this + 0x10) = p;
  QtPrivate::lengthHelperPointer<char>("qt_abstractscrollarea_filter");
  QVar1.m_size = (size_t)"qt_abstractscrollarea_filter";
  QVar1.field_0.m_data_utf8 = (char *)this;
  QObject::setObjectName(QVar1);
  return;
}

Assistant:

bool eventFilter(QObject *o, QEvent *e) override
    { return (o == d->viewport ? d->viewportEvent(e) : false); }